

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TThreadsFactory.cpp
# Opt level: O0

void __thiscall TThreadsFactory::WaitForAllThreads(TThreadsFactory *this)

{
  uint *in_RDI;
  uint i_1;
  uint i;
  uint local_10;
  uint local_c;
  
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    sem_wait((sem_t *)(in_RDI + 2));
  }
  for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
    sem_post((sem_t *)(in_RDI + 2));
  }
  return;
}

Assistant:

void TThreadsFactory::WaitForAllThreads(void)
{
    /* Wait for all the threads to complete
     * Beware, this will lock any new thread creation
     */
    for (unsigned int i = 0; i < fMaxThreads; ++i)
        sem_wait(&fCreationLimiter);

    /* Unlock everything now */
    for (unsigned int i = 0; i < fMaxThreads; ++i)
        sem_post(&fCreationLimiter);
}